

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

ptls_key_schedule_t *
key_schedule_new(ptls_cipher_suite_t *preferred,ptls_cipher_suite_t **offered,int use_outer)

{
  ptls_cipher_suite_t **pppVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_hash_algorithm_t *ppVar3;
  size_t sVar4;
  ulong uVar5;
  ptls_key_schedule_t *sched;
  ptls_hash_context_t *ppVar6;
  size_t i;
  long lVar7;
  long lVar8;
  size_t i_1;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  
  uVar5 = (ulong)(preferred != (ptls_cipher_suite_t *)0x0);
  if (offered != (ptls_cipher_suite_t **)0x0) {
    for (lVar7 = 0; ppVar2 = offered[lVar7], ppVar2 != (ptls_cipher_suite_t *)0x0; lVar7 = lVar7 + 1
        ) {
      if ((preferred == (ptls_cipher_suite_t *)0x0) || (ppVar2->hash != preferred->hash)) {
        lVar8 = 0;
        do {
          lVar9 = lVar8;
          if (lVar7 == lVar9) break;
          lVar8 = lVar9 + 1;
        } while (ppVar2->hash != offered[lVar9]->hash);
        uVar5 = uVar5 + (lVar7 == lVar9);
      }
    }
  }
  sched = (ptls_key_schedule_t *)malloc(uVar5 * 0x18 + 0x50);
  if (sched == (ptls_key_schedule_t *)0x0) {
LAB_001069e0:
    sched = (ptls_key_schedule_t *)0x0;
  }
  else {
    sched->hashes[0].ctx_outer = (ptls_hash_context_t *)0x0;
    auVar10 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])(sched->secret + 0x3c) = ZEXT1632(auVar10);
    *(undefined1 (*) [32])(sched->secret + 0x1c) = ZEXT1632(auVar10);
    auVar11 = ZEXT1632(auVar10);
    sched->generation = auVar11._0_4_;
    sched->secret[0] = auVar11[4];
    sched->secret[1] = auVar11[5];
    sched->secret[2] = auVar11[6];
    sched->secret[3] = auVar11[7];
    sched->secret[4] = auVar11[8];
    sched->secret[5] = auVar11[9];
    sched->secret[6] = auVar11[10];
    sched->secret[7] = auVar11[0xb];
    sched->secret[8] = auVar11[0xc];
    sched->secret[9] = auVar11[0xd];
    sched->secret[10] = auVar11[0xe];
    sched->secret[0xb] = auVar11[0xf];
    sched->secret[0xc] = auVar11[0x10];
    sched->secret[0xd] = auVar11[0x11];
    sched->secret[0xe] = auVar11[0x12];
    sched->secret[0xf] = auVar11[0x13];
    sched->secret[0x10] = auVar11[0x14];
    sched->secret[0x11] = auVar11[0x15];
    sched->secret[0x12] = auVar11[0x16];
    sched->secret[0x13] = auVar11[0x17];
    sched->secret[0x14] = auVar11[0x18];
    sched->secret[0x15] = auVar11[0x19];
    sched->secret[0x16] = auVar11[0x1a];
    sched->secret[0x17] = auVar11[0x1b];
    sched->secret[0x18] = auVar11[0x1c];
    sched->secret[0x19] = auVar11[0x1d];
    sched->secret[0x1a] = auVar11[0x1e];
    sched->secret[0x1b] = auVar11[0x1f];
    if (preferred != (ptls_cipher_suite_t *)0x0) {
      ppVar3 = preferred->hash;
      sVar4 = sched->num_hashes;
      sched->hashes[sVar4].algo = ppVar3;
      ppVar6 = (*ppVar3->create)();
      sched->hashes[sVar4].ctx = ppVar6;
      if (ppVar6 == (ptls_hash_context_t *)0x0) {
LAB_001069d6:
        key_schedule_free(sched);
        goto LAB_001069e0;
      }
      if (use_outer == 0) {
        sched->hashes[sVar4].ctx_outer = (ptls_hash_context_t *)0x0;
      }
      else {
        ppVar6 = (*preferred->hash->create)();
        sched->hashes[sVar4].ctx_outer = ppVar6;
        if (ppVar6 == (ptls_hash_context_t *)0x0) goto LAB_001069d6;
      }
      sched->num_hashes = sVar4 + 1;
    }
    if (offered != (ptls_cipher_suite_t **)0x0) {
      for (lVar7 = 0; ppVar2 = offered[lVar7], ppVar2 != (ptls_cipher_suite_t *)0x0;
          lVar7 = lVar7 + 1) {
        if ((preferred == (ptls_cipher_suite_t *)0x0) || (ppVar2->hash != preferred->hash)) {
          ppVar3 = ppVar2->hash;
          lVar8 = 0;
          do {
            if (lVar7 == lVar8) {
              sVar4 = sched->num_hashes;
              sched->hashes[sVar4].algo = ppVar3;
              ppVar6 = (*ppVar3->create)();
              sched->hashes[sVar4].ctx = ppVar6;
              if (ppVar6 == (ptls_hash_context_t *)0x0) goto LAB_001069d6;
              if (use_outer == 0) {
                sched->hashes[sVar4].ctx_outer = (ptls_hash_context_t *)0x0;
              }
              else {
                ppVar6 = (*ppVar2->hash->create)();
                sched->hashes[sVar4].ctx_outer = ppVar6;
                if (ppVar6 == (ptls_hash_context_t *)0x0) goto LAB_001069d6;
              }
              sched->num_hashes = sVar4 + 1;
              break;
            }
            pppVar1 = offered + lVar8;
            lVar8 = lVar8 + 1;
          } while (ppVar3 != (*pppVar1)->hash);
        }
      }
    }
  }
  return sched;
}

Assistant:

static ptls_key_schedule_t *key_schedule_new(ptls_cipher_suite_t *preferred, ptls_cipher_suite_t **offered, int use_outer)
{
#define FOREACH_HASH(block)                                                                                                        \
    do {                                                                                                                           \
        ptls_cipher_suite_t *cs;                                                                                                   \
        if ((cs = preferred) != NULL) {                                                                                            \
            block                                                                                                                  \
        }                                                                                                                          \
        if (offered != NULL) {                                                                                                     \
            size_t i, j;                                                                                                           \
            for (i = 0; (cs = offered[i]) != NULL; ++i) {                                                                          \
                if (preferred == NULL || cs->hash != preferred->hash) {                                                            \
                    for (j = 0; j != i; ++j)                                                                                       \
                        if (cs->hash == offered[j]->hash)                                                                          \
                            break;                                                                                                 \
                    if (j == i) {                                                                                                  \
                        block                                                                                                      \
                    }                                                                                                              \
                }                                                                                                                  \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)

    ptls_key_schedule_t *sched;

    { /* allocate */
        size_t num_hashes = 0;
        FOREACH_HASH({ ++num_hashes; });
        if ((sched = malloc(offsetof(ptls_key_schedule_t, hashes) + sizeof(sched->hashes[0]) * num_hashes)) == NULL)
            return NULL;
        *sched = (ptls_key_schedule_t){0};
    }

    /* setup the hash algos and contexts */
    FOREACH_HASH({
        sched->hashes[sched->num_hashes].algo = cs->hash;
        if ((sched->hashes[sched->num_hashes].ctx = cs->hash->create()) == NULL)
            goto Fail;
        if (use_outer) {
            if ((sched->hashes[sched->num_hashes].ctx_outer = cs->hash->create()) == NULL)
                goto Fail;
        } else {
            sched->hashes[sched->num_hashes].ctx_outer = NULL;
        }
        ++sched->num_hashes;
    });

    return sched;
Fail:
    key_schedule_free(sched);
    return NULL;

#undef FOREACH_HASH
}